

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O0

Kit_DsdNtk_t * Kit_DsdDecomposeInt(uint *pTruth,int nVars,int nDecMux)

{
  int iVar1;
  uint uWord;
  Kit_DsdNtk_t *pNtk_00;
  Kit_DsdObj_t *pObj_00;
  uint *pOut;
  int local_38;
  int nVarsReal;
  int i;
  uint uSupp;
  Kit_DsdObj_t *pObj;
  Kit_DsdNtk_t *pNtk;
  int nDecMux_local;
  int nVars_local;
  uint *pTruth_local;
  
  if (0x10 < nVars) {
    __assert_fail("nVars <= 16",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitDsd.c"
                  ,0x8e1,"Kit_DsdNtk_t *Kit_DsdDecomposeInt(unsigned int *, int, int)");
  }
  pNtk_00 = Kit_DsdNtkAlloc(nVars);
  iVar1 = Abc_Var2Lit((uint)pNtk_00->nVars,0);
  pNtk_00->Root = (unsigned_short)iVar1;
  pObj_00 = Kit_DsdObjAlloc(pNtk_00,KIT_DSD_PRIME,nVars);
  if (*pNtk_00->pNodes != pObj_00) {
    __assert_fail("pNtk->pNodes[0] == pObj",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitDsd.c"
                  ,0x8e6,"Kit_DsdNtk_t *Kit_DsdDecomposeInt(unsigned int *, int, int)");
  }
  for (local_38 = 0; local_38 < nVars; local_38 = local_38 + 1) {
    iVar1 = Abc_Var2Lit(local_38,0);
    *(short *)(&pObj_00[1].field_0x0 + (long)local_38 * 2) = (short)iVar1;
  }
  pOut = Kit_DsdObjTruth(pObj_00);
  Kit_TruthCopy(pOut,pTruth,nVars);
  uWord = Kit_TruthSupport(pTruth,nVars);
  iVar1 = Kit_WordCountOnes(uWord);
  if (iVar1 == 0) {
    *pObj_00 = (Kit_DsdObj_t)((uint)*pObj_00 & 0xfffffe3f | 0x40);
    *pObj_00 = (Kit_DsdObj_t)((uint)*pObj_00 & 0x3ffffff);
    if (*pTruth == 0) {
      iVar1 = Abc_LitNot((uint)pNtk_00->Root);
      pNtk_00->Root = (unsigned_short)iVar1;
    }
  }
  else if (iVar1 == 1) {
    *pObj_00 = (Kit_DsdObj_t)((uint)*pObj_00 & 0xfffffe3f | 0x80);
    *pObj_00 = (Kit_DsdObj_t)((uint)*pObj_00 & 0x3ffffff | 0x4000000);
    iVar1 = Kit_WordFindFirstBit(uWord);
    iVar1 = Abc_Var2Lit(iVar1,*pTruth & 1);
    *(short *)(pObj_00 + 1) = (short)iVar1;
  }
  else {
    Kit_DsdDecompose_rec(pNtk_00,*pNtk_00->pNodes,uWord,&pNtk_00->Root,nDecMux);
  }
  return pNtk_00;
}

Assistant:

Kit_DsdNtk_t * Kit_DsdDecomposeInt( unsigned * pTruth, int nVars, int nDecMux )
{
    Kit_DsdNtk_t * pNtk;
    Kit_DsdObj_t * pObj;
    unsigned uSupp;
    int i, nVarsReal;
    assert( nVars <= 16 );
    pNtk = Kit_DsdNtkAlloc( nVars );
    pNtk->Root = Abc_Var2Lit( pNtk->nVars, 0 );
    // create the first node
    pObj = Kit_DsdObjAlloc( pNtk, KIT_DSD_PRIME, nVars );
    assert( pNtk->pNodes[0] == pObj );
    for ( i = 0; i < nVars; i++ )
       pObj->pFans[i] = Abc_Var2Lit( i, 0 );
    Kit_TruthCopy( Kit_DsdObjTruth(pObj), pTruth, nVars );
    uSupp = Kit_TruthSupport( pTruth, nVars );
    // consider special cases
    nVarsReal = Kit_WordCountOnes( uSupp );
    if ( nVarsReal == 0 )
    {
        pObj->Type = KIT_DSD_CONST1;
        pObj->nFans = 0;
        if ( pTruth[0] == 0 )
             pNtk->Root = Abc_LitNot(pNtk->Root);
        return pNtk;
    }
    if ( nVarsReal == 1 )
    {
        pObj->Type = KIT_DSD_VAR;
        pObj->nFans = 1;
        pObj->pFans[0] = Abc_Var2Lit( Kit_WordFindFirstBit(uSupp), (pTruth[0] & 1) );
        return pNtk;
    }
    Kit_DsdDecompose_rec( pNtk, pNtk->pNodes[0], uSupp, &pNtk->Root, nDecMux );
    return pNtk;
}